

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_keyword_all_write(NGP_HDU *ngph,fitsfile *ffp,int mode)

{
  int iVar1;
  int *status;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int *unaff_retaddr;
  long l;
  char buf [200];
  int ib;
  int r;
  int i;
  char *in_stack_ffffffffffffff00;
  NGP_TOKEN *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  fitsfile *in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  fitsfile *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  fitsfile *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  int local_24;
  int local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI == (int *)0x0) {
    local_24 = 0x16a;
  }
  else if (in_RSI == 0) {
    local_24 = 0x16a;
  }
  else {
    local_24 = 0;
    for (local_20 = 0; local_20 < *in_RDI; local_20 = local_20 + 1) {
      local_24 = ngp_keyword_is_write(in_stack_ffffffffffffff08);
      if (((in_EDX & 1) == 0) && (local_24 != 0)) {
        if (((local_24 == 0x170) && (*(long *)(in_RDI + 2) + (long)local_20 * 0xb0 != -0x60)) &&
           (*(char *)(*(long *)(in_RDI + 2) + (long)local_20 * 0xb0 + 0x60) != '\0')) {
          ffmcom((fitsfile *)l,(char *)unaff_retaddr,
                 (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
        }
        local_24 = 0;
      }
      else {
        status = (int *)(ulong)(*(int *)(*(long *)(in_RDI + 2) + (long)local_20 * 0xb0) - 1);
        switch(status) {
        case (int *)0x0:
          ffpky(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                (char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                (char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
          break;
        case (int *)0x1:
          ffpkls(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 (char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,status);
          break;
        case (int *)0x2:
          in_stack_ffffffffffffff00 =
               (char *)(long)*(int *)(*(long *)(in_RDI + 2) + (long)local_20 * 0xb0 + 0x50);
          ffpky(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                (char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                (char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
          break;
        case (int *)0x3:
          ffpky(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                (char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                (char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
          break;
        case (int *)0x4:
          ffpky(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                (char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                (char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
          break;
        case (int *)0x5:
          ffpkyu(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
          break;
        case (int *)0x6:
          iVar1 = strcmp("HISTORY",(char *)(*(long *)(in_RDI + 2) + (long)local_20 * 0xb0 + 4));
          if (iVar1 == 0) {
            ffphis(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          }
          else {
            iVar1 = strcmp("COMMENT",(char *)(*(long *)(in_RDI + 2) + (long)local_20 * 0xb0 + 4));
            if (iVar1 == 0) {
              ffpcom(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            }
            else {
              snprintf(&stack0xffffffffffffff08,200,"%-8.8s%s",
                       *(long *)(in_RDI + 2) + (long)local_20 * 0xb0 + 4,
                       *(long *)(in_RDI + 2) + (long)local_20 * 0xb0 + 0x60);
              ffprec(in_stack_ffffffffffffff78,
                     (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     &in_stack_ffffffffffffff68->HDUposition);
            }
          }
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    ffrdef((fitsfile *)l,unaff_retaddr);
  }
  return local_24;
}

Assistant:

int     ngp_keyword_all_write(NGP_HDU *ngph, fitsfile *ffp, int mode)
 { int		i, r, ib;
   char		buf[200];
   long		l;


   if (NULL == ngph) return(NGP_NUL_PTR);
   if (NULL == ffp) return(NGP_NUL_PTR);
   r = NGP_OK;
   
   for (i=0; i<ngph->tokcnt; i++)
    { r = ngp_keyword_is_write(&(ngph->tok[i]));
      if ((NGP_REALLY_ALL & mode) || (NGP_OK == r))
        { switch (ngph->tok[i].type)
           { case NGP_TTYPE_BOOL:
			ib = ngph->tok[i].value.b;
			fits_write_key(ffp, TLOGICAL, ngph->tok[i].name, &ib, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_STRING:
			fits_write_key_longstr(ffp, ngph->tok[i].name, ngph->tok[i].value.s, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_INT:
			l = ngph->tok[i].value.i;	/* bugfix - 22-Jan-99, BO - nonalignment of OSF/Alpha */
			fits_write_key(ffp, TLONG, ngph->tok[i].name, &l, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_REAL:
			fits_write_key(ffp, TDOUBLE, ngph->tok[i].name, &(ngph->tok[i].value.d), ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_COMPLEX:
			fits_write_key(ffp, TDBLCOMPLEX, ngph->tok[i].name, &(ngph->tok[i].value.c), ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_NULL:
			fits_write_key_null(ffp, ngph->tok[i].name, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_RAW:
			if (0 == strcmp("HISTORY", ngph->tok[i].name))
			  { fits_write_history(ffp, ngph->tok[i].comment, &r);
			    break;
			  }
			if (0 == strcmp("COMMENT", ngph->tok[i].name))
			  { fits_write_comment(ffp, ngph->tok[i].comment, &r);
			    break;
			  }
			snprintf(buf,200, "%-8.8s%s", ngph->tok[i].name, ngph->tok[i].comment);
			fits_write_record(ffp, buf, &r);
                        break;
           }
        }
      else if (NGP_BAD_ARG == r) /* enhancement 10 dec 2003, James Peachey: template comments replace defaults */
        { r = NGP_OK;						/* update comments of special keywords like TFORM */
          if (ngph->tok[i].comment && *ngph->tok[i].comment)	/* do not update with a blank comment */
            { fits_modify_comment(ffp, ngph->tok[i].name, ngph->tok[i].comment, &r);
            }
        }
      else /* other problem, typically a blank token */
        { r = NGP_OK;						/* skip this token, but continue */
        }
      if (r) return(r);
    }
     
   fits_set_hdustruc(ffp, &r);				/* resync cfitsio */
   return(r);
 }